

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O0

MPP_RET check_re_enc(RcModelV2Ctx *ctx,EncRcTaskInfo *cfg)

{
  EncFrmType EVar1;
  RK_S32 RVar2;
  uint uVar3;
  int iVar4;
  MPP_RET MVar5;
  int iVar6;
  MPP_RET local_44;
  RK_S32 ret;
  RK_S32 target_bps;
  RK_S32 ins_bps;
  RK_S32 last_ins_bps;
  RK_S32 stat_time;
  RK_S32 bit_thr;
  RK_S32 frame_type;
  RcCfg *usr_cfg;
  EncRcTaskInfo *cfg_local;
  RcModelV2Ctx *ctx_local;
  
  EVar1 = cfg->frame_type;
  last_ins_bps = 0;
  iVar4 = (ctx->usr_cfg).stats_time;
  RVar2 = mpp_data_sum_v2(ctx->stat_bits);
  uVar3 = RVar2 / iVar4;
  RVar2 = mpp_data_get_pre_val_v2(ctx->stat_bits,-1);
  iVar4 = (int)((uVar3 * iVar4 - RVar2) + cfg->bit_real) / iVar4;
  local_44 = MPP_OK;
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter %p\n","check_re_enc",ctx);
  }
  if ((rc_debug & 0x40) != 0) {
    _mpp_log_l(4,"rc_model_v2","reenc check target_bps %d last_ins_bps %d ins_bps %d","check_re_enc"
               ,(ulong)(uint)(ctx->usr_cfg).bps_target,(ulong)uVar3,iVar4);
  }
  if (ctx->reenc_cnt < (ctx->usr_cfg).max_reencode_times) {
    MVar5 = check_super_frame(ctx,cfg);
    if (MVar5 == MPP_OK) {
      if (((ctx->usr_cfg).debreath_cfg.enable == 0) || (ctx->first_frm_flg != 0)) {
        if ((rc_debug & 0x200) != 0) {
          _mpp_log_l(4,"rc_model_v2","drop mode %d frame_type %d\n",(char *)0x0,
                     (ulong)(ctx->usr_cfg).drop_mode,(ulong)EVar1);
        }
        if (((ctx->usr_cfg).drop_mode == MPP_ENC_RC_DROP_FRM_DISABLED) || (EVar1 != INTER_P_FRAME))
        {
          if (EVar1 == INTER_P_FRAME) {
            last_ins_bps = cfg->bit_target * 3;
          }
          else if (EVar1 == INTRA_FRAME) {
            last_ins_bps = (cfg->bit_target * 3) / 2;
          }
          if (last_ins_bps < cfg->bit_real) {
            if ((ctx->usr_cfg).mode == RC_CBR) {
              iVar6 = (ctx->usr_cfg).bps_target;
              if ((iVar6 / 0x14 < (int)(iVar4 - uVar3)) &&
                 ((iVar6 + iVar6 / 10 < iVar4 || (iVar4 < iVar6 - iVar6 / 10)))) {
                local_44 = MPP_NOK;
              }
            }
            else {
              iVar6 = (ctx->usr_cfg).bps_max;
              if ((iVar6 - (iVar6 >> 3) < iVar4) && (iVar6 / 0x14 < (int)(iVar4 - uVar3))) {
                local_44 = MPP_NOK;
              }
            }
          }
          if ((rc_debug & 1) != 0) {
            _mpp_log_l(4,"rc_model_v2","leave %p ret %d\n","check_re_enc",ctx,(ulong)(uint)local_44)
            ;
          }
          ctx_local._4_4_ = local_44;
        }
        else {
          iVar6 = (int)((float)((ctx->usr_cfg).bps_max * ((ctx->usr_cfg).drop_thd + 100)) / 100.0);
          if ((rc_debug & 0x200) != 0) {
            _mpp_log_l(4,"rc_model_v2","drop mode %d check max_bps %d bit_thr %d ins_bps %d",
                       (char *)0x0,(ulong)(ctx->usr_cfg).drop_mode,
                       (ulong)(uint)(ctx->usr_cfg).bps_target,iVar6,iVar4);
          }
          ctx_local._4_4_ = MPP_OK;
          if (iVar6 < iVar4) {
            ctx_local._4_4_ = MPP_NOK;
          }
        }
      }
      else {
        ctx_local._4_4_ = MPP_OK;
      }
    }
    else {
      ctx_local._4_4_ = MPP_NOK;
    }
  }
  else {
    ctx_local._4_4_ = MPP_OK;
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET check_re_enc(RcModelV2Ctx *ctx, EncRcTaskInfo *cfg)
{
    RcCfg *usr_cfg = &ctx->usr_cfg;
    RK_S32 frame_type = cfg->frame_type;
    RK_S32 bit_thr = 0;
    RK_S32 stat_time = usr_cfg->stats_time;
    RK_S32 last_ins_bps = mpp_data_sum_v2(ctx->stat_bits) / stat_time;
    RK_S32 ins_bps = (last_ins_bps * stat_time - mpp_data_get_pre_val_v2(ctx->stat_bits, -1)
                      + cfg->bit_real) / stat_time;
    RK_S32 target_bps;
    RK_S32 ret = MPP_OK;

    rc_dbg_func("enter %p\n", ctx);
    rc_dbg_rc("reenc check target_bps %d last_ins_bps %d ins_bps %d",
              usr_cfg->bps_target, last_ins_bps, ins_bps);

    if (ctx->reenc_cnt >= usr_cfg->max_reencode_times)
        return MPP_OK;

    if (check_super_frame(ctx, cfg))
        return MPP_NOK;

    if (usr_cfg->debreath_cfg.enable && !ctx->first_frm_flg)
        return MPP_OK;

    rc_dbg_drop("drop mode %d frame_type %d\n", usr_cfg->drop_mode, frame_type);
    if (usr_cfg->drop_mode && frame_type == INTER_P_FRAME) {
        bit_thr = (RK_S32)(usr_cfg->bps_max * (100 + usr_cfg->drop_thd) / (float)100);
        rc_dbg_drop("drop mode %d check max_bps %d bit_thr %d ins_bps %d",
                    usr_cfg->drop_mode, usr_cfg->bps_target, bit_thr, ins_bps);
        return (ins_bps > bit_thr) ? MPP_NOK : MPP_OK;
    }

    switch (frame_type) {
    case INTRA_FRAME:
        bit_thr = 3 * cfg->bit_target / 2;
        break;
    case INTER_P_FRAME:
        bit_thr = 3 * cfg->bit_target;
        break;
    default:
        break;
    }

    if (cfg->bit_real > bit_thr) {
        if (usr_cfg->mode == RC_CBR) {
            target_bps = usr_cfg->bps_target;
            if (target_bps / 20 < ins_bps - last_ins_bps &&
                (target_bps + target_bps / 10 < ins_bps
                 || target_bps - target_bps / 10 > ins_bps)) {
                ret =  MPP_NOK;
            }
        } else {
            target_bps = usr_cfg->bps_max;
            if ((target_bps - (target_bps >> 3) < ins_bps) &&
                (target_bps / 20  < ins_bps - last_ins_bps)) {
                ret =  MPP_NOK;
            }
        }
    }

    rc_dbg_func("leave %p ret %d\n", ctx, ret);
    return ret;
}